

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::olc_UpdateMouse(PixelGameEngine *this,int32_t x,int32_t y)

{
  int iVar1;
  vi2d local_20;
  int local_18;
  int local_14;
  int32_t y_local;
  int32_t x_local;
  PixelGameEngine *this_local;
  
  this->bHasMouseFocus = true;
  local_18 = y;
  local_14 = x;
  _y_local = this;
  v2d_generic<int>::v2d_generic(&local_20,x,y);
  this->vMouseWindowPos = local_20;
  iVar1 = (this->vViewPos).y;
  (this->vMousePosCache).x =
       (int)(((float)(local_14 - (this->vViewPos).x) /
             (float)((this->vWindowSize).x + (this->vViewPos).x * -2)) *
            (float)(this->vScreenSize).x);
  (this->vMousePosCache).y =
       (int)(((float)(local_18 - iVar1) / (float)((this->vWindowSize).y + (this->vViewPos).y * -2))
            * (float)(this->vScreenSize).y);
  if ((this->vScreenSize).x <= (this->vMousePosCache).x) {
    (this->vMousePosCache).x = (this->vScreenSize).x + -1;
  }
  if ((this->vScreenSize).y <= (this->vMousePosCache).y) {
    (this->vMousePosCache).y = (this->vScreenSize).y + -1;
  }
  if ((this->vMousePosCache).x < 0) {
    (this->vMousePosCache).x = 0;
  }
  if ((this->vMousePosCache).y < 0) {
    (this->vMousePosCache).y = 0;
  }
  return;
}

Assistant:

void PixelGameEngine::olc_UpdateMouse(int32_t x, int32_t y)
	{
		// Mouse coords come in screen space
		// But leave in pixel space
		bHasMouseFocus = true;
		vMouseWindowPos = { x, y };
		// Full Screen mode may have a weird viewport we must clamp to
		x -= vViewPos.x;
		y -= vViewPos.y;
		vMousePosCache.x = (int32_t)(((float)x / (float)(vWindowSize.x - (vViewPos.x * 2)) * (float)vScreenSize.x));
		vMousePosCache.y = (int32_t)(((float)y / (float)(vWindowSize.y - (vViewPos.y * 2)) * (float)vScreenSize.y));
		if (vMousePosCache.x >= (int32_t)vScreenSize.x)	vMousePosCache.x = vScreenSize.x - 1;
		if (vMousePosCache.y >= (int32_t)vScreenSize.y)	vMousePosCache.y = vScreenSize.y - 1;
		if (vMousePosCache.x < 0) vMousePosCache.x = 0;
		if (vMousePosCache.y < 0) vMousePosCache.y = 0;
	}